

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O3

bool __thiscall
ithipublisher::PrintVector
          (ithipublisher *this,FILE *F,vector<double,_std::allocator<double>_> *vx,double mult)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = fprintf((FILE *)F,"[");
  bVar5 = 0 < iVar1;
  pdVar2 = (vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        iVar1 = fprintf((FILE *)F,", ");
        bVar5 = (bool)(bVar5 & 0 < iVar1);
        pdVar2 = (double *)
                 ((long)(vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4);
      }
      iVar1 = fprintf((FILE *)F,"%8f",*pdVar2 * mult);
      bVar5 = (bool)(0 < iVar1 & bVar5);
      uVar3 = uVar3 + 1;
      pdVar2 = (vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (uVar3 < (ulong)((long)(vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                   .super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  iVar1 = fprintf((FILE *)F,"]");
  return (bool)(0 < iVar1 & bVar5);
}

Assistant:

bool ithipublisher::PrintVector(FILE * F, std::vector<double> * vx, double mult)
{
    bool ret = (fprintf(F, "[") > 0);
    for (size_t i = 0; i < vx->size(); i++)
    {
        if (i != 0)
        {
            ret &= fprintf(F, ", ") > 0;
        }

        ret &= fprintf(F, "%8f", mult*(*vx)[i]) > 0;
    }

    ret &= fprintf(F, "]") > 0;

    return ret;
}